

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint imm;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x10,4);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  if (uVar2 == 0xf) {
    uVar4 = MCInst_getOpcode(pMStack_18);
    switch(uVar4) {
    case 0x942:
      MCInst_setOpcode(pMStack_18,0x947);
      break;
    default:
      return MCDisassembler_Fail;
    case 0x951:
      MCInst_setOpcode(pMStack_18,0x956);
      break;
    case 0x959:
      MCInst_setOpcode(pMStack_18,0x95e);
      break;
    case 0x961:
      MCInst_setOpcode(pMStack_18,0x966);
      break;
    case 0x969:
      MCInst_setOpcode(pMStack_18,0x96e);
    }
    Inst_local._4_4_ = DecodeT2LoadLabel(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Rn)
    ;
  }
  else {
    DVar5 = DecoderGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rt,DVar5);
    if (_Var1) {
      DVar5 = DecodeT2AddrModeImm8(pMStack_18,uVar2 << 9 | uVar3,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rt,DVar5);
      if (_Var1) {
        Inst_local._4_4_ = Rt;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LoadT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRT:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBT:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHT:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSBT:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSHT:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}